

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O3

int __thiscall cmXMLParser::CleanupParser(cmXMLParser *this)

{
  int iVar1;
  int iVar2;
  
  if (this->Parser == (XML_Parser)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Parser not initialized",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    this->ParseError = 1;
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    if (this->ParseError == 0) {
      iVar2 = 1;
      iVar1 = cm_expat_XML_Parse(this->Parser,"",0,1);
      if (iVar1 == 0) {
        (*this->_vptr_cmXMLParser[0xb])(this);
        iVar2 = 0;
      }
    }
    cm_expat_XML_ParserFree(this->Parser);
    this->Parser = (void *)0x0;
  }
  return iVar2;
}

Assistant:

int cmXMLParser::CleanupParser()
{
  if ( !this->Parser )
    {
    std::cerr << "Parser not initialized" << std::endl;
    this->ParseError = 1;
    return 0;
    }
  int result = !this->ParseError;
  if(result)
    {
    // Tell the expat XML parser about the end-of-input.
    if(!XML_Parse(static_cast<XML_Parser>(this->Parser), "", 0, 1))
      {
      this->ReportXmlParseError();
      result = 0;
      }
    }

  // Clean up the parser.
  XML_ParserFree(static_cast<XML_Parser>(this->Parser));
  this->Parser = 0;

  return result;
}